

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitBlock(Graph *this,Block *curr)

{
  mapped_type pEVar1;
  bool bVar2;
  mapped_type *ppEVar3;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Expression **ppEVar4;
  pointer ppVar5;
  vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
  *states;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
  local_60;
  iterator iter;
  Expression *child;
  Iterator __end2;
  Iterator __begin2;
  ExpressionList *__range2;
  mapped_type local_20;
  Expression *oldParent;
  Block *curr_local;
  Graph *this_local;
  
  pEVar1 = this->parent;
  __range2 = (ExpressionList *)curr;
  local_20 = pEVar1;
  oldParent = (Expression *)curr;
  curr_local = (Block *)this;
  ppEVar3 = std::
            unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
            ::operator[](&this->expressionParentMap,(key_type *)&__range2);
  *ppEVar3 = pEVar1;
  this->parent = oldParent;
  this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(oldParent + 2);
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin(this_00);
  _child = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end(this_00);
  while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                 operator!=((Iterator *)&__end2.index,(Iterator *)&child), bVar2) {
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&__end2.index);
    iter.
    super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
               )*ppEVar4;
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
               (Expression *)
               iter.
               super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
               ._M_cur);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end2.index);
  }
  bVar2 = IString::is((IString *)(oldParent + 1));
  if (bVar2) {
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>_>
         ::find(&this->breakStates,(key_type *)(oldParent + 1));
    states = (vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
              *)std::
                unordered_map<wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>_>
                ::end(&this->breakStates);
    bVar2 = std::__detail::operator!=
                      (&local_60,
                       (_Node_iterator_base<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_true>
                        *)&states);
    if (bVar2) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>,_false,_true>
                             *)&local_60);
      bVar2 = isInUnreachable(this);
      if (!bVar2) {
        std::
        vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
        ::push_back(&ppVar5->second,&this->locals);
      }
      mergeBlock(this,&ppVar5->second,&this->locals);
    }
  }
  this->parent = local_20;
  return &this->bad;
}

Assistant:

Node* doVisitBlock(Block* curr) {
    // TODO: handle super-deep nesting
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    for (auto* child : curr->list) {
      visit(child);
    }
    // Merge the outputs
    // TODO handle conditions on these breaks
    if (curr->name.is()) {
      auto iter = breakStates.find(curr->name);
      if (iter != breakStates.end()) {
        auto& states = iter->second;
        // Add the state flowing out
        if (!isInUnreachable()) {
          states.push_back(locals);
        }
        mergeBlock(states, locals);
      }
    }
    parent = oldParent;
    return &bad;
  }